

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_StatusCode
UA_SecureChannelManager_open
          (UA_SecureChannelManager *cm,UA_Connection *conn,UA_OpenSecureChannelRequest *request,
          UA_OpenSecureChannelResponse *response)

{
  UA_UInt32 UVar1;
  channel_list_entry *pcVar2;
  UA_Boolean UVar3;
  channel_list_entry *channel;
  UA_DateTime UVar4;
  UA_String UVar5;
  UA_UInt32 local_4c;
  size_t local_48;
  UA_Byte *local_40;
  channel_list_entry *entry;
  UA_OpenSecureChannelResponse *response_local;
  UA_OpenSecureChannelRequest *request_local;
  UA_Connection *conn_local;
  UA_SecureChannelManager *cm_local;
  
  if (request->securityMode == UA_MESSAGESECURITYMODE_NONE) {
    if (((uint)(cm->server->config).maxSecureChannels <= cm->currentChannelCount) &&
       (UVar3 = purgeFirstChannelWithoutSession(cm), !UVar3)) {
      return 0x80030000;
    }
    channel = (channel_list_entry *)malloc(0xe8);
    if (channel == (channel_list_entry *)0x0) {
      cm_local._4_4_ = 0x80030000;
    }
    else {
      UA_SecureChannel_init((UA_SecureChannel *)channel);
      UVar1 = cm->lastChannelId;
      cm->lastChannelId = UVar1 + 1;
      (channel->channel).securityToken.channelId = UVar1;
      UVar1 = cm->lastTokenId;
      cm->lastTokenId = UVar1 + 1;
      (channel->channel).securityToken.tokenId = UVar1;
      UVar4 = UA_DateTime_now();
      (channel->channel).securityToken.createdAt = UVar4;
      if ((cm->server->config).maxSecurityTokenLifetime < request->requestedLifetime) {
        local_4c = (cm->server->config).maxSecurityTokenLifetime;
      }
      else {
        local_4c = request->requestedLifetime;
      }
      (channel->channel).securityToken.revisedLifetime = local_4c;
      if ((channel->channel).securityToken.revisedLifetime == 0) {
        (channel->channel).securityToken.revisedLifetime =
             (cm->server->config).maxSecurityTokenLifetime;
      }
      UA_ByteString_copy(&request->clientNonce,&(channel->channel).clientNonce);
      UVar5 = UA_String_fromChars("http://opcfoundation.org/UA/SecurityPolicy#None");
      local_48 = UVar5.length;
      (channel->channel).serverAsymAlgSettings.securityPolicyUri.length = local_48;
      local_40 = UVar5.data;
      (channel->channel).serverAsymAlgSettings.securityPolicyUri.data = local_40;
      UA_SecureChannel_generateNonce(&(channel->channel).serverNonce);
      UA_ByteString_copy(&(channel->channel).serverNonce,&response->serverNonce);
      UA_ChannelSecurityToken_copy(&(channel->channel).securityToken,&response->securityToken);
      UVar4 = UA_DateTime_now();
      (response->responseHeader).timestamp = UVar4;
      UVar4 = UA_DateTime_nowMonotonic();
      (channel->channel).securityToken.createdAt = UVar4;
      UA_Connection_attachSecureChannel(conn,(UA_SecureChannel *)channel);
      pcVar2 = (cm->channels).lh_first;
      (channel->pointers).le_next = pcVar2;
      if (pcVar2 != (channel_list_entry *)0x0) {
        (((cm->channels).lh_first)->pointers).le_prev = &(channel->pointers).le_next;
      }
      (cm->channels).lh_first = channel;
      (channel->pointers).le_prev = (channel_list_entry **)cm;
      UA_atomic_add(&cm->currentChannelCount,1);
      cm_local._4_4_ = 0;
    }
  }
  else {
    cm_local._4_4_ = 0x80540000;
  }
  return cm_local._4_4_;
}

Assistant:

UA_StatusCode
UA_SecureChannelManager_open(UA_SecureChannelManager *cm, UA_Connection *conn,
                             const UA_OpenSecureChannelRequest *request,
                             UA_OpenSecureChannelResponse *response) {
    if(request->securityMode != UA_MESSAGESECURITYMODE_NONE)
        return UA_STATUSCODE_BADSECURITYMODEREJECTED;

    //check if there exists a free SC, otherwise try to purge one SC without a session
    //the purge has been introduced to pass CTT, it is not clear what strategy is expected here
    if(cm->currentChannelCount >= cm->server->config.maxSecureChannels && !purgeFirstChannelWithoutSession(cm)){
        return UA_STATUSCODE_BADOUTOFMEMORY;
    }

    /* Set up the channel */
    channel_list_entry *entry = UA_malloc(sizeof(channel_list_entry));
    if(!entry)
        return UA_STATUSCODE_BADOUTOFMEMORY;
    UA_SecureChannel_init(&entry->channel);
    entry->channel.securityToken.channelId = cm->lastChannelId++;
    entry->channel.securityToken.tokenId = cm->lastTokenId++;
    entry->channel.securityToken.createdAt = UA_DateTime_now();
    entry->channel.securityToken.revisedLifetime =
        (request->requestedLifetime > cm->server->config.maxSecurityTokenLifetime) ?
        cm->server->config.maxSecurityTokenLifetime : request->requestedLifetime;
    if(entry->channel.securityToken.revisedLifetime == 0) /* lifetime 0 -> set the maximum possible */
        entry->channel.securityToken.revisedLifetime = cm->server->config.maxSecurityTokenLifetime;
    UA_ByteString_copy(&request->clientNonce, &entry->channel.clientNonce);
    entry->channel.serverAsymAlgSettings.securityPolicyUri =
        UA_STRING_ALLOC("http://opcfoundation.org/UA/SecurityPolicy#None");
    UA_SecureChannel_generateNonce(&entry->channel.serverNonce);

    /* Set the response */
    UA_ByteString_copy(&entry->channel.serverNonce, &response->serverNonce);
    UA_ChannelSecurityToken_copy(&entry->channel.securityToken, &response->securityToken);
    response->responseHeader.timestamp = UA_DateTime_now();

    /* Now overwrite the creation date with the internal monotonic clock */
    entry->channel.securityToken.createdAt = UA_DateTime_nowMonotonic();

    /* Set all the pointers internally */
    UA_Connection_attachSecureChannel(conn, &entry->channel);
    LIST_INSERT_HEAD(&cm->channels, entry, pointers);
    UA_atomic_add(&cm->currentChannelCount, 1);
    return UA_STATUSCODE_GOOD;
}